

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void P_FallingDamage(AActor *actor)

{
  int damage_00;
  AActor *pAVar1;
  uint uVar2;
  uint uVar3;
  TAngle<double> local_30;
  FName local_28;
  FSoundID local_24;
  double local_20;
  double vel;
  int damage;
  int damagestyle;
  AActor *actor_local;
  
  uVar2 = level.flags >> 0xf;
  _damage = actor;
  uVar3 = FIntCVar::operator_cast_to_int(&dmflags);
  pAVar1 = _damage;
  vel._4_4_ = (uVar2 | uVar3) & 0x18;
  if ((vel._4_4_ != 0) && ((_damage->floorsector->Flags & 2) == 0)) {
    local_20 = ABS((_damage->Vel).Z);
    if (vel._4_4_ == 8) {
      if (local_20 <= 19.0) {
        return;
      }
      if (local_20 < 84.0) {
        vel._0_4_ = (int)((local_20 * local_20 * 0.0859375 - 30.0) / 2.0);
        if (vel._0_4_ < 1) {
          vel._0_4_ = 1;
        }
      }
      else {
        vel._0_4_ = 1000000;
      }
    }
    else if (vel._4_4_ == 0x10) {
      if (local_20 <= 23.0) {
        return;
      }
      if (local_20 < 63.0) {
        local_20 = local_20 * 0.6956521739130435;
        vel._0_4_ = (int)((local_20 * local_20) / 10.0 - 24.0);
        if (((-39.0 < (_damage->Vel).Z) && (_damage->health < vel._0_4_)) && (_damage->health != 1))
        {
          vel._0_4_ = _damage->health + -1;
        }
      }
      else {
        vel._0_4_ = 1000000;
      }
    }
    else {
      if (vel._4_4_ != 0x18) {
        return;
      }
      if (local_20 <= 20.0) {
        return;
      }
      vel._0_4_ = (int)(local_20 / 0.3814697265625);
    }
    if (_damage->player != (player_t *)0x0) {
      FSoundID::FSoundID(&local_24,"*land");
      S_Sound(pAVar1,0,&local_24,1.0,1.0);
      P_NoiseAlert(_damage,_damage,true,0.0);
      if ((vel._0_4_ == 1000000) && ((_damage->player->cheats & 0x8000002U) != 0)) {
        vel._0_4_ = 999;
      }
    }
    pAVar1 = _damage;
    damage_00 = vel._0_4_;
    FName::FName(&local_28,NAME_Falling);
    TAngle<double>::TAngle(&local_30,0.0);
    P_DamageMobj(pAVar1,(AActor *)0x0,(AActor *)0x0,damage_00,&local_28,0,&local_30);
  }
  return;
}

Assistant:

void P_FallingDamage (AActor *actor)
{
	int damagestyle;
	int damage;
	double vel;

	damagestyle = ((level.flags >> 15) | (dmflags)) &
		(DF_FORCE_FALLINGZD | DF_FORCE_FALLINGHX);

	if (damagestyle == 0)
		return;
		
	if (actor->floorsector->Flags & SECF_NOFALLINGDAMAGE)
		return;

	vel = fabs(actor->Vel.Z);

	// Since Hexen falling damage is stronger than ZDoom's, it takes
	// precedence. ZDoom falling damage may not be as strong, but it
	// gets felt sooner.

	switch (damagestyle)
	{
	case DF_FORCE_FALLINGHX:		// Hexen falling damage
		if (vel <= 23)
		{ // Not fast enough to hurt
			return;
		}
		if (vel >= 63)
		{ // automatic death
			damage = 1000000;
		}
		else
		{
			vel *= (16. / 23);
			damage = int((vel * vel) / 10 - 24);
			if (actor->Vel.Z > -39 && damage > actor->health
				&& actor->health != 1)
			{ // No-death threshold
				damage = actor->health-1;
			}
		}
		break;
	
	case DF_FORCE_FALLINGZD:		// ZDoom falling damage
		if (vel <= 19)
		{ // Not fast enough to hurt
			return;
		}
		if (vel >= 84)
		{ // automatic death
			damage = 1000000;
		}
		else
		{
			damage = int((vel*vel*(11 / 128.) - 30) / 2);
			if (damage < 1)
			{
				damage = 1;
			}
		}
		break;

	case DF_FORCE_FALLINGST:		// Strife falling damage
		if (vel <= 20)
		{ // Not fast enough to hurt
			return;
		}
		// The minimum amount of damage you take from falling in Strife
		// is 52. Ouch!
		damage = int(vel / (25000./65536.));
		break;

	default:
		return;
	}

	if (actor->player)
	{
		S_Sound (actor, CHAN_AUTO, "*land", 1, ATTN_NORM);
		P_NoiseAlert (actor, actor, true);
		if (damage == 1000000 && (actor->player->cheats & (CF_GODMODE | CF_BUDDHA)))
		{
			damage = 999;
		}
	}
	P_DamageMobj (actor, NULL, NULL, damage, NAME_Falling);
}